

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q6_K_impl(float *x,block_q6_K *y,int64_t n_per_row,float *quant_weights)

{
  byte bVar1;
  byte bVar2;
  ggml_fp16_t gVar3;
  int iVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  uint8_t q4;
  uint8_t q3;
  uint8_t q2;
  uint8_t q1;
  int l_1;
  int j_1;
  uint8_t *qh;
  uint8_t *ql;
  int l;
  int ii;
  float d;
  int j;
  int ib_1;
  float iscale;
  float abs_scale;
  float *qw;
  float scale;
  int ib;
  float max_abs_scale;
  float max_scale;
  int i;
  float scales [16];
  int8_t L [256];
  int64_t nb;
  int local_1d4;
  char local_1d0;
  int local_1cc;
  undefined1 local_1c8;
  int local_1c0;
  int local_1bc;
  long local_1b8;
  long in_stack_fffffffffffffe50;
  int local_1a0;
  int local_198;
  int local_194;
  float local_17c;
  int local_178;
  float local_174;
  float local_170;
  int local_16c;
  float afStack_168 [16];
  byte local_128 [16];
  float *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  int8_t *in_stack_fffffffffffffef8;
  float *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  long local_8;
  
  local_8 = in_RDI;
  for (local_16c = 0; (long)local_16c < in_RDX / 0x100; local_16c = local_16c + 1) {
    local_170 = 0.0;
    local_174 = 0.0;
    for (local_178 = 0; local_178 < 0x10; local_178 = local_178 + 1) {
      if (in_RCX == 0) {
        local_17c = make_qx_quants(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                                   in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                                   in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
      }
      else {
        local_17c = make_qx_quants(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                                   in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                                   in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
      }
      afStack_168[local_178] = local_17c;
      if (local_174 < ABS(local_17c)) {
        local_170 = local_17c;
        local_174 = ABS(local_17c);
      }
    }
    fVar5 = (float)((ulong)in_stack_fffffffffffffe50 >> 0x20);
    if (1e-15 <= local_174) {
      gVar3 = ggml_compute_fp32_to_fp16(fVar5);
      *(ggml_fp16_t *)(in_RSI + (long)local_16c * 0xd2 + 0xd0) = gVar3;
      for (local_194 = 0; local_194 < 0x10; local_194 = local_194 + 1) {
        iVar4 = nearest_int((-128.0 / local_170) * afStack_168[local_194]);
        if (iVar4 < 0x80) {
          iVar4 = nearest_int((-128.0 / local_170) * afStack_168[local_194]);
          local_1c8 = (undefined1)iVar4;
        }
        else {
          local_1c8 = 0x7f;
        }
        *(undefined1 *)(in_RSI + (long)local_16c * 0xd2 + 0xc0 + (long)local_194) = local_1c8;
      }
      for (local_198 = 0; local_198 < 0x10; local_198 = local_198 + 1) {
        fVar5 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RSI + (long)local_16c * 0xd2 + 0xd0));
        fVar5 = fVar5 * (float)(int)*(char *)(in_RSI + (long)local_16c * 0xd2 + 0xc0 +
                                             (long)local_198);
        if ((fVar5 != 0.0) || (NAN(fVar5))) {
          for (local_1a0 = 0; local_1a0 < 0x10; local_1a0 = local_1a0 + 1) {
            local_1d4 = nearest_int(*(float *)(local_8 + (long)(local_198 * 0x10 + local_1a0) * 4) /
                                    fVar5);
            local_1cc = local_1d4;
            if (0x1f < local_1d4) {
              local_1cc = 0x1f;
            }
            if (local_1cc < -0x20) {
              local_1d0 = -0x20;
            }
            else {
              if (0x1f < local_1d4) {
                local_1d4 = 0x1f;
              }
              local_1d0 = (char)local_1d4;
            }
            local_128[local_198 * 0x10 + local_1a0] = local_1d0 + 0x20;
          }
        }
      }
      in_stack_fffffffffffffe50 = in_RSI + (long)local_16c * 0xd2;
      local_1b8 = in_RSI + (long)local_16c * 0xd2 + 0x80;
      for (local_1bc = 0; local_1bc < 0x100; local_1bc = local_1bc + 0x80) {
        for (local_1c0 = 0; local_1c0 < 0x20; local_1c0 = local_1c0 + 1) {
          bVar1 = local_128[local_1bc + local_1c0 + 0x20];
          bVar2 = local_128[local_1bc + local_1c0 + 0x60];
          *(byte *)(in_stack_fffffffffffffe50 + local_1c0) =
               local_128[local_1bc + local_1c0] & 0xf | local_128[local_1bc + local_1c0 + 0x40] << 4
          ;
          *(byte *)(in_stack_fffffffffffffe50 + (local_1c0 + 0x20)) = bVar1 & 0xf | bVar2 << 4;
          *(byte *)(local_1b8 + local_1c0) =
               (char)local_128[local_1bc + local_1c0] >> 4 |
               (byte)(((int)(char)local_128[local_1bc + local_1c0 + 0x20] >> 4) << 2) |
               (byte)(((int)(char)local_128[local_1bc + local_1c0 + 0x40] >> 4) << 4) |
               (byte)(((int)(char)local_128[local_1bc + local_1c0 + 0x60] >> 4) << 6);
        }
        in_stack_fffffffffffffe50 = in_stack_fffffffffffffe50 + 0x40;
        local_1b8 = local_1b8 + 0x20;
      }
    }
    else {
      memset((void *)(in_RSI + (long)local_16c * 0xd2),0,0xd2);
      gVar3 = ggml_compute_fp32_to_fp16(fVar5);
      *(ggml_fp16_t *)(in_RSI + (long)local_16c * 0xd2 + 0xd0) = gVar3;
    }
    local_8 = local_8 + 0x400;
  }
  return;
}

Assistant:

static void quantize_row_q6_K_impl(const float * GGML_RESTRICT x, block_q6_K * GGML_RESTRICT y, int64_t n_per_row, const float * quant_weights) {
    assert(n_per_row % QK_K == 0);
    const int64_t nb = n_per_row / QK_K;

    int8_t L[QK_K];
    float   scales[QK_K/16];
    //float   weights[16];

    for (int i = 0; i < nb; i++) {

        //float sum_x2 = 0;
        //for (int j = 0; j < QK_K; ++j) sum_x2 += x[j]*x[j];
        //float sigma2 = sum_x2/QK_K;

        float max_scale = 0;
        float max_abs_scale = 0;

        for (int ib = 0; ib < QK_K/16; ++ib) {

            float scale;
            if (quant_weights) {
                const float * qw = quant_weights + QK_K*i + 16*ib;
                //for (int j = 0; j < 16; ++j) weights[j] = qw[j] * sqrtf(sigma2 + x[16*ib + j]*x[16*ib + j]);
                //scale = make_qx_quants(16, 32, x + 16*ib, L + 16*ib, 1, weights);
                scale = make_qx_quants(16, 32, x + 16*ib, L + 16*ib, 1, qw);
            } else {
                scale = make_qx_quants(16, 32, x + 16*ib, L + 16*ib, 1, NULL);
            }
            scales[ib] = scale;

            const float abs_scale = fabsf(scale);
            if (abs_scale > max_abs_scale) {
                max_abs_scale = abs_scale;
                max_scale = scale;
            }

        }

        if (max_abs_scale < GROUP_MAX_EPS) {
            memset(&y[i], 0, sizeof(block_q6_K));
            y[i].d = GGML_FP32_TO_FP16(0.f);
            x += QK_K;
            continue;
        }

        float iscale = -128.f/max_scale;
        y[i].d = GGML_FP32_TO_FP16(1/iscale);
        for (int ib = 0; ib < QK_K/16; ++ib) {
            y[i].scales[ib] = MIN(127, nearest_int(iscale*scales[ib]));
        }

        for (int j = 0; j < QK_K/16; ++j) {
            float d = GGML_FP16_TO_FP32(y[i].d) * y[i].scales[j];
            if (!d) {
                continue;
            }
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int(x[16*j + ii]/d);
                l = MAX(-32, MIN(31, l));
                L[16*j + ii] = l + 32;
            }
        }

        uint8_t * GGML_RESTRICT ql = y[i].ql;
        uint8_t * GGML_RESTRICT qh = y[i].qh;
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                const uint8_t q1 = L[j + l +  0] & 0xF;
                const uint8_t q2 = L[j + l + 32] & 0xF;
                const uint8_t q3 = L[j + l + 64] & 0xF;
                const uint8_t q4 = L[j + l + 96] & 0xF;
                ql[l+ 0] = q1 | (q3 << 4);
                ql[l+32] = q2 | (q4 << 4);
                qh[l] = (L[j + l] >> 4) | ((L[j + l + 32] >> 4) << 2) | ((L[j + l + 64] >> 4) << 4) | ((L[j + l + 96] >> 4) << 6);
            }
            ql += 64;
            qh += 32;
        }

        x += QK_K;

    }
}